

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

void InitDefaultsscc_info_Option_google_2fprotobuf_2ftype_2eproto(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2df5a4,0x2df5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/type.pb.cc"
            );
  _DAT_003c7f10 = 0;
  google::protobuf::_Option_default_instance_ = &PTR__Option_003bca58;
  DAT_003c7f28 = 0;
  if (scc_info_Option_google_2fprotobuf_2ftype_2eproto.base.visit_status.super___atomic_base<int>.
      _M_i != 0) {
    google::protobuf::internal::InitSCCImpl(&scc_info_Option_google_2fprotobuf_2ftype_2eproto.base);
  }
  DAT_003c7f18 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003c7f20 = (undefined1 *)0x0;
  google::protobuf::internal::OnShutdownRun
            (google::protobuf::internal::DestroyMessage,&google::protobuf::_Option_default_instance_
            );
  DAT_003c7f20 = google::protobuf::_Any_default_instance_;
  return;
}

Assistant:

static void InitDefaultsscc_info_Option_google_2fprotobuf_2ftype_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_Option_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::Option();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::Option::InitAsDefaultInstance();
}